

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_info.hpp
# Opt level: O0

void __thiscall mp::FlatModelInfoImpl::InitConstraintCount(FlatModelInfoImpl *this)

{
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)0x514b2c);
  std::
  unordered_map<std::reference_wrapper<const_std::type_info>,_int,_mp::FlatModelInfoImpl::TypeInfoRefHasher,_mp::FlatModelInfoImpl::TypeInfoRefEqualTo,_std::allocator<std::pair<const_std::reference_wrapper<const_std::type_info>,_int>_>_>
  ::clear((unordered_map<std::reference_wrapper<const_std::type_info>,_int,_mp::FlatModelInfoImpl::TypeInfoRefHasher,_mp::FlatModelInfoImpl::TypeInfoRefEqualTo,_std::allocator<std::pair<const_std::reference_wrapper<const_std::type_info>,_int>_>_>
           *)0x514b3a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
           *)0x514b48);
  return;
}

Assistant:

void InitConstraintCount() override
  { cg_map_.clear(); ti_map_.clear(); coninfo_map_.clear(); }